

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

Belief * __thiscall despot::LaserTag::InitialBelief(LaserTag *this,State *start,string *type)

{
  int iVar1;
  ParticleBelief *pPVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_90;
  ParticleBelief *local_78;
  ParticleBelief *belief;
  ParticleBelief *local_68;
  TagState *state;
  int opp;
  int rob;
  double wgt;
  int local_3c;
  undefined1 local_38 [4];
  int N;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  string *type_local;
  State *start_local;
  LaserTag *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  local_3c = despot::Floor::NumCells();
  _opp = (1.0 / (double)local_3c) / (double)local_3c;
  for (state._4_4_ = 0; state._4_4_ < local_3c; state._4_4_ = state._4_4_ + 1) {
    for (state._0_4_ = 0; (int)state < local_3c; state._0_4_ = (int)state + 1) {
      iVar1 = BaseTag::RobOppIndicesToStateIndex(&this->super_BaseTag,state._4_4_,(int)state);
      belief = (ParticleBelief *)
               (**(code **)(*(long *)&this->super_BaseTag + 0xe0))(_opp,this,iVar1);
      local_68 = belief;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38,
                 (value_type *)&belief);
    }
  }
  pPVar2 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_90,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  despot::ParticleBelief::ParticleBelief
            (pPVar2,&local_90,&(this->super_BaseTag).super_BeliefMDP,0,1);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_90);
  local_78 = pPVar2;
  despot::ParticleBelief::state_indexer((StateIndexer *)pPVar2);
  pPVar2 = local_78;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_38);
  return (Belief *)pPVar2;
}

Assistant:

Belief* LaserTag::InitialBelief(const State* start, string type) const {
	//assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob, opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}